

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMTrack.cpp
# Opt level: O2

void __thiscall
Storage::Disk::PCMTrack::PCMTrack
          (PCMTrack *this,
          vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *segments)

{
  pointer pPVar1;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *__range1;
  PCMSegment *segment;
  pointer pPVar2;
  Time total_length;
  Time proportion_of_whole;
  Time original_length_of_segment;
  PCMSegment length_adjusted_segment;
  Time local_a0;
  Time local_98;
  Time local_90;
  PCMSegment local_88;
  
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__PCMTrack_0058ee30;
  (this->segment_event_sources_).
  super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->segment_event_sources_).
  super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->segment_event_sources_).
  super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->segment_pointer_ = 0;
  this->is_resampled_clone_ = false;
  local_a0.length = 0;
  local_a0.clock_rate = 1;
  pPVar1 = (segments->
           super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar2 = (segments->
                super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                )._M_impl.super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    local_88.length_of_a_bit =
         Time::operator*(&pPVar2->length_of_a_bit,
                         (*(int *)&(pPVar2->data).super__Bvector_base<std::allocator<bool>_>._M_impl
                                   .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                         - *(int *)&(pPVar2->data).super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p) * 8 +
                         (pPVar2->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
    Time::operator+=(&local_a0,&local_88.length_of_a_bit);
  }
  Time::simplify(&local_a0);
  pPVar1 = (segments->
           super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar2 = (segments->
                super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                )._M_impl.super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    local_90 = Time::operator*(&pPVar2->length_of_a_bit,
                               (*(int *)&(pPVar2->data).super__Bvector_base<std::allocator<bool>_>.
                                         _M_impl.super__Bvector_impl_data._M_finish.
                                         super__Bit_iterator_base._M_p -
                               *(int *)&(pPVar2->data).super__Bvector_base<std::allocator<bool>_>.
                                        _M_impl.super__Bvector_impl_data._M_start.
                                        super__Bit_iterator_base._M_p) * 8 +
                               (pPVar2->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                              );
    local_98 = Time::operator/(&local_90,&local_a0);
    Time::simplify(&local_98);
    PCMSegment::PCMSegment(&local_88,pPVar2);
    local_88.length_of_a_bit =
         Time::operator/(&local_98,
                         (*(int *)&(pPVar2->data).super__Bvector_base<std::allocator<bool>_>._M_impl
                                   .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                         - *(int *)&(pPVar2->data).super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p) * 8 +
                         (pPVar2->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
    Time::simplify(&local_88.length_of_a_bit);
    std::
    vector<Storage::Disk::PCMSegmentEventSource,std::allocator<Storage::Disk::PCMSegmentEventSource>>
    ::emplace_back<Storage::Disk::PCMSegment&>
              ((vector<Storage::Disk::PCMSegmentEventSource,std::allocator<Storage::Disk::PCMSegmentEventSource>>
                *)&this->segment_event_sources_,&local_88);
    PCMSegment::~PCMSegment(&local_88);
  }
  return;
}

Assistant:

PCMTrack::PCMTrack(const std::vector<PCMSegment> &segments) : PCMTrack() {
	// sum total length of all segments
	Time total_length;
	for(const auto &segment : segments) {
		total_length += segment.length_of_a_bit * unsigned(segment.data.size());
	}
	total_length.simplify();

	// each segment is then some proportion of the total; for them all to sum to 1 they'll
	// need to be adjusted to be
	for(const auto &segment : segments) {
		Time original_length_of_segment = segment.length_of_a_bit * unsigned(segment.data.size());
		Time proportion_of_whole = original_length_of_segment / total_length;
		proportion_of_whole.simplify();
		PCMSegment length_adjusted_segment = segment;
		length_adjusted_segment.length_of_a_bit = proportion_of_whole / unsigned(segment.data.size());
		length_adjusted_segment.length_of_a_bit.simplify();
		segment_event_sources_.emplace_back(length_adjusted_segment);
	}
}